

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O2

void __thiscall SQCompiler::UnaryOP(SQCompiler *this,SQOpcode op)

{
  SQFuncState *this_00;
  SQInteger arg1;
  SQInteger arg0;
  
  PrefixedExpr(this);
  arg1 = SQFuncState::PopTarget(this->_fs);
  this_00 = this->_fs;
  arg0 = SQFuncState::PushTarget(this_00,-1);
  SQFuncState::AddInstruction(this_00,op,arg0,arg1,0,0);
  return;
}

Assistant:

void UnaryOP(SQOpcode op)
    {
        PrefixedExpr();
        SQInteger src = _fs->PopTarget();
        _fs->AddInstruction(op, _fs->PushTarget(), src);
    }